

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absGla.c
# Opt level: O0

uint Ga2_ObjComputeTruth_rec(Gia_Man_t *p,Gia_Obj_t *pObj,int fFirst)

{
  int iVar1;
  Gia_Obj_t *pGVar2;
  uint local_4c;
  uint local_44;
  uint Val1;
  uint Val0;
  int fFirst_local;
  Gia_Obj_t *pObj_local;
  Gia_Man_t *p_local;
  
  if ((*(long *)pObj < 0) && (fFirst == 0)) {
    p_local._4_4_ = pObj->Value;
  }
  else {
    iVar1 = Gia_ObjIsAnd(pObj);
    if (iVar1 == 0) {
      __assert_fail("Gia_ObjIsAnd(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absGla.c"
                    ,0x91,"unsigned int Ga2_ObjComputeTruth_rec(Gia_Man_t *, Gia_Obj_t *, int)");
    }
    pGVar2 = Gia_ObjFanin0(pObj);
    local_44 = Ga2_ObjComputeTruth_rec(p,pGVar2,0);
    pGVar2 = Gia_ObjFanin1(pObj);
    local_4c = Ga2_ObjComputeTruth_rec(p,pGVar2,0);
    iVar1 = Gia_ObjFaninC0(pObj);
    if (iVar1 != 0) {
      local_44 = local_44 ^ 0xffffffff;
    }
    iVar1 = Gia_ObjFaninC1(pObj);
    if (iVar1 != 0) {
      local_4c = local_4c ^ 0xffffffff;
    }
    p_local._4_4_ = local_44 & local_4c;
  }
  return p_local._4_4_;
}

Assistant:

unsigned Ga2_ObjComputeTruth_rec( Gia_Man_t * p, Gia_Obj_t * pObj, int fFirst )
{
    unsigned Val0, Val1;
    if ( pObj->fPhase && !fFirst )
        return pObj->Value;
    assert( Gia_ObjIsAnd(pObj) );
    Val0 = Ga2_ObjComputeTruth_rec( p, Gia_ObjFanin0(pObj), 0 );
    Val1 = Ga2_ObjComputeTruth_rec( p, Gia_ObjFanin1(pObj), 0 );
    return (Gia_ObjFaninC0(pObj) ? ~Val0 : Val0) & (Gia_ObjFaninC1(pObj) ? ~Val1 : Val1);
}